

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O2

void __thiscall hwnet::TCPSocket::Do(TCPSocket *this)

{
  _List_node_base *p_Var1;
  Poller *this_00;
  bool bVar2;
  int iVar3;
  byte bVar4;
  bool bVar5;
  undefined1 auStack_78 [8];
  value_type front;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  _List_node_base *local_48;
  _List_node_base *local_40;
  pthread_mutex_t *local_38;
  
  local_38 = (pthread_mutex_t *)&this->mtx;
  local_40 = (_List_node_base *)&this->closures;
  local_48 = (_List_node_base *)&this->recvList;
  iVar3 = 10;
  while( true ) {
    std::mutex::lock((mutex *)&local_38->__data);
    p_Var1 = (((_List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
              &local_40->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var1 != local_40) {
      std::function<void_()>::function
                ((function<void_()> *)auStack_78,(function<void_()> *)(p_Var1 + 1));
      std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
      pop_front((list<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)local_40);
      std::function<void_()>::operator()((function<void_()> *)auStack_78);
      std::_Function_base::~_Function_base((_Function_base *)auStack_78);
    }
    if ((this->readable != true) ||
       (bVar4 = 1,
       (this->recvList).
       super__List_base<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_>
       ._M_impl._M_node.super__List_node_base._M_next == local_48)) {
      bVar4 = this->socketError;
    }
    bVar2 = canWrite(this);
    if (((bVar4 | bVar2) != 1) || (((this->closed)._M_base._M_i & 1U) != 0)) break;
    pthread_mutex_unlock(local_38);
    bVar5 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar5) {
      this_00 = this->poller_;
      std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<hwnet::TCPSocket,void>
                ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)&front._M_invoker,
                 (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<hwnet::TCPSocket>);
      auStack_78 = (undefined1  [8])front._M_invoker;
      front.super__Function_base._M_functor._M_unused._M_object = _Stack_50._M_pi;
      front._M_invoker = (_Invoker_type)0x0;
      _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Poller::PostTask(this_00,(Ptr *)auStack_78,this->pool_);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&front);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
      return;
    }
    if (bVar4 != 0) {
      recvInWorker(this);
    }
    if (bVar2) {
      sendInWorker(this);
    }
  }
  if (((this->closed)._M_base._M_i & 1U) != 0) {
    pthread_mutex_unlock(local_38);
    doClose(this);
    return;
  }
  this->doing = false;
  pthread_mutex_unlock(local_38);
  return;
}

Assistant:

void TCPSocket::Do() {
	static const int maxLoop = 10;
	auto doClose = false;	
	//this->tid = std::this_thread::get_id();
	auto i = 0;
	for( ;;i++) {
		this->mtx.lock();
		if(!this->closures.empty()) {
			auto front = this->closures.front();
			this->closures.pop_front();
			front();
		}

		auto canRead_ = canRead();
		auto canWrite_ = canWrite();
		if(!(canRead_ || canWrite_) || this->closed) {
			if(!closed) {
				this->doing =false;
			} else {
				doClose = true;
			}
			this->mtx.unlock();
			if(doClose){
				this->doClose();
			}
			//this->tid = std::thread::id();
			return;
		}
		this->mtx.unlock();
		if(i >= maxLoop){
			//执行次数过多了，暂停一下，将cpu让给其它任务执行
			//this->tid = std::thread::id();
			poller_->PostTask(shared_from_this(),this->pool_);
			return;
		} else {


			if(canRead_){
				recvInWorker();
			}

#ifdef USE_SSL
			if(canWrite_){
				sendInWorkerSSL();
			}
#else
			if(canWrite_){
				sendInWorker();
			}
#endif

		}
	}
}